

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::Draw::anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
createInstance(DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this,
              Context *context)

{
  DrawTestInstanceBase *this_00;
  
  this_00 = (DrawTestInstanceBase *)operator_new(0x1a8);
  DrawTestInstanceBase::DrawTestInstanceBase(this_00,context);
  (this_00->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__DrawTestInstance_00d32738;
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  vector((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> *)
         (this_00 + 1),
         (vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> *)
         &this->m_data);
  *(VkPrimitiveTopology *)
   &this_00[1].m_data.vertices.
    super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
    ._M_impl.super__Vector_impl_data._M_finish = (this->m_data).super_DrawParamsBase.topology;
  std::vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>::vector
            ((vector<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_> *)
             &this_00[1].m_data.vertices.
              super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&(this->m_data).commands);
  (*(this_00->super_TestInstance)._vptr_TestInstance[3])(this_00);
  DrawTestInstanceBase::initialize(this_00,(DrawParamsBase *)(this_00 + 1));
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* DrawTestCase<T>::createInstance (Context& context) const
{
	return new DrawTestInstance<T>(context, m_data);
}